

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

float __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsFloat(X3DImporter *this,int pAttrIdx)

{
  FIReader *pFVar1;
  float *pfVar2;
  int iVar3;
  undefined4 extraout_var;
  DeadlyImportError *this_00;
  X3DImporter *this_01;
  float local_60;
  float tvalf;
  string val;
  shared_ptr<const_Assimp::FIFloatValue> floatValue;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&val,pFVar1,pAttrIdx);
  std::dynamic_pointer_cast<Assimp::FIFloatValue_const,Assimp::FIValue_const>
            ((shared_ptr<const_Assimp::FIValue> *)&floatValue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&val._M_string_length);
  if (floatValue.super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    val._M_dataplus._M_p = (pointer)&val.field_2;
    val._M_string_length = 0;
    val.field_2._M_local_buf[0] = '\0';
    this_01 = (X3DImporter *)
              (this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar3 = (*(this_01->super_BaseImporter)._vptr_BaseImporter[6])(this_01,pAttrIdx);
    ParseHelper_FixTruncatedFloatString(this_01,(char *)CONCAT44(extraout_var,iVar3),&val);
    fast_atoreal_move<float>(val._M_dataplus._M_p,&tvalf,false);
    local_60 = tvalf;
    std::__cxx11::string::~string((string *)&val);
  }
  else {
    pfVar2 = ((floatValue.super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((floatValue.
                super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pfVar2 != 4) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&val,"Invalid float value",(allocator *)&tvalf);
      DeadlyImportError::DeadlyImportError(this_00,&val);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_60 = *pfVar2;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&floatValue.super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return local_60;
}

Assistant:

float X3DImporter::XML_ReadNode_GetAttrVal_AsFloat(const int pAttrIdx)
{
    auto floatValue = std::dynamic_pointer_cast<const FIFloatValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (floatValue) {
        if (floatValue->value.size() == 1) {
            return floatValue->value.front();
        }
        throw DeadlyImportError("Invalid float value");
    }
    else {
        std::string val;
        float tvalf;

        ParseHelper_FixTruncatedFloatString(mReader->getAttributeValue(pAttrIdx), val);
        fast_atoreal_move(val.c_str(), tvalf, false);

        return tvalf;
    }
}